

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::
read_internal(basic_csv_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
             error_code *ec)

{
  bool bVar1;
  size_type sVar2;
  basic_csv_parser<char,_std::allocator<char>_> *this_00;
  pointer data;
  error_code *in_RSI;
  error_code *in_RDI;
  text_source_adaptor<jsoncons::stream_source<char>_> *unaff_retaddr;
  span<const_char,_18446744073709551615UL> s;
  basic_json_visitor<char> *in_stack_00000038;
  basic_csv_parser<char,_std::allocator<char>_> *in_stack_00000040;
  error_code *in_stack_ffffffffffffffe0;
  error_code *ec_00;
  
  ec_00 = in_RDI;
  bVar1 = text_source_adaptor<jsoncons::stream_source<char>_>::is_error
                    ((text_source_adaptor<jsoncons::stream_source<char>_> *)0x48e1e1);
  if (bVar1) {
    std::error_code::operator=(in_stack_ffffffffffffffe0,(csv_errc)((ulong)in_RDI >> 0x20));
  }
  else {
    do {
      bVar1 = basic_csv_parser<char,_std::allocator<char>_>::stopped
                        ((basic_csv_parser<char,_std::allocator<char>_> *)(in_RDI + 0x1b));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return;
      }
      bVar1 = basic_csv_parser<char,_std::allocator<char>_>::source_exhausted
                        ((basic_csv_parser<char,_std::allocator<char>_> *)(in_RDI + 0x1b));
      if (bVar1) {
        text_source_adaptor<jsoncons::stream_source<char>_>::read_buffer(unaff_retaddr,ec_00);
        bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
        if (bVar1) {
          return;
        }
        sVar2 = jsoncons::detail::span<const_char,_18446744073709551615UL>::size
                          ((span<const_char,_18446744073709551615UL> *)&stack0xffffffffffffffe0);
        if (sVar2 != 0) {
          this_00 = (basic_csv_parser<char,_std::allocator<char>_> *)(in_RDI + 0x1b);
          data = jsoncons::detail::span<const_char,_18446744073709551615UL>::data
                           ((span<const_char,_18446744073709551615UL> *)&stack0xffffffffffffffe0);
          sVar2 = jsoncons::detail::span<const_char,_18446744073709551615UL>::size
                            ((span<const_char,_18446744073709551615UL> *)&stack0xffffffffffffffe0);
          basic_csv_parser<char,_std::allocator<char>_>::update(this_00,data,sVar2);
        }
      }
      basic_csv_parser<char,_std::allocator<char>_>::parse_some
                (in_stack_00000040,in_stack_00000038,(error_code *)this);
      bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
    } while (!bVar1);
  }
  return;
}

Assistant:

void read_internal(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = csv_errc::source_error;
                return;
            }   
            while (!parser_.stopped())
            {
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                parser_.parse_some(visitor_, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
            }
        }